

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  ulong uVar1;
  char *__s;
  ostream *poVar2;
  size_t sVar3;
  pointer pcVar4;
  int iVar5;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)section);
  poVar2 = std::operator<<(os,local_50);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_50);
  for (pcVar4 = (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar4 != (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish; pcVar4 = pcVar4 + 1) {
    if ((pcVar4->Name)._M_string_length == 0) {
      std::operator<<(os,"\n");
      this->TextIndent = "";
      PrintFormatted(this,os,(pcVar4->Brief)._M_dataplus._M_p);
    }
    else {
      poVar2 = std::operator<<(os,"  ");
      std::operator<<(poVar2,(string *)pcVar4);
      this->TextIndent = "                                 ";
      for (iVar5 = (int)(pcVar4->Name)._M_string_length; iVar5 < 0x1d; iVar5 = iVar5 + 1) {
        std::operator<<(os," ");
      }
      uVar1 = (pcVar4->Name)._M_string_length;
      sVar3 = strlen(this->TextIndent);
      if (sVar3 - 4 < uVar1) {
        std::operator<<(os,"\n");
        __s = this->TextIndent;
        strlen(__s);
        std::ostream::write((char *)os,(long)__s);
      }
      std::operator<<(os,"= ");
      PrintColumn(this,os,(pcVar4->Brief)._M_dataplus._M_p);
      std::operator<<(os,"\n");
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry>& entries = section.GetEntries();
  for (std::vector<cmDocumentationEntry>::const_iterator op = entries.begin();
       op != entries.end(); ++op) {
    if (!op->Name.empty()) {
      os << "  " << op->Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent)) - 4;
      for (int i = static_cast<int>(op->Name.size()); i < align; ++i) {
        os << " ";
      }
      if (op->Name.size() > strlen(this->TextIndent) - 4) {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent) - 2);
      }
      os << "= ";
      this->PrintColumn(os, op->Brief.c_str());
      os << "\n";
    } else {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, op->Brief.c_str());
    }
  }
  os << "\n";
}